

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall glslang::HlslParseContext::wasFlattened(HlslParseContext *this,TIntermTyped *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  
  if (node == (TIntermTyped *)0x0) {
    return false;
  }
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    bVar7 = false;
  }
  else {
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
    lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x180))
                      ((long *)CONCAT44(extraout_var_00,iVar1));
    p_Var4 = (this->flattenMap).
             super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &(this->flattenMap).
              super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var5->_M_header;
    p_Var6 = &p_Var5->_M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        if (lVar2 <= *(long *)(p_Var4 + 1)) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < lVar2];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var3 != p_Var5) && (p_Var6 = p_Var3, lVar2 < *(long *)(p_Var3 + 1)))
      {
        p_Var6 = &p_Var5->_M_header;
      }
    }
    bVar7 = (_Rb_tree_header *)p_Var6 != p_Var5;
  }
  return bVar7;
}

Assistant:

bool HlslParseContext::wasFlattened(const TIntermTyped* node) const
{
    return node != nullptr && node->getAsSymbolNode() != nullptr &&
           wasFlattened(node->getAsSymbolNode()->getId());
}